

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int SaveDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FILE *__s;
  size_t sVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  char header [4];
  undefined8 local_28;
  undefined8 local_20;
  
  auVar6 = in_ZMM1._0_16_;
  if (deepImage == (DeepImage *)0x0 || filename == (char *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "Invalid argument.";
LAB_001434a6:
    *err = pcVar4;
    return -1;
  }
  __s = fopen(filename,"rb");
  if (__s == (FILE *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "Cannot write file.";
    goto LAB_001434a6;
  }
  local_28._0_4_ = 0x1312f76;
  sVar3 = fwrite(&local_28,1,4,__s);
  if (sVar3 == 4) {
    local_28._0_4_ = 0x802;
    sVar3 = fwrite(&local_28,1,4,__s);
    if (sVar3 == 4) {
      local_28 = CONCAT44(local_28._4_4_,2);
      anon_unknown.dwarf_108287::WriteAttribute
                ((FILE *)__s,"compression","compression",(uchar *)&local_28,4);
      local_28 = 0;
      uVar1 = deepImage->width;
      uVar2 = deepImage->height;
      auVar5._4_4_ = uVar2;
      auVar5._0_4_ = uVar1;
      auVar6 = vpcmpeqd_avx(auVar6,auVar6);
      auVar5._8_8_ = 0;
      auVar6 = vpaddd_avx(auVar5,auVar6);
      local_20 = auVar6._0_8_;
      anon_unknown.dwarf_108287::WriteAttribute
                ((FILE *)__s,"dataWindow","box2i",(uchar *)&local_28,0x10);
      anon_unknown.dwarf_108287::WriteAttribute
                ((FILE *)__s,"displayWindow","box2i",(uchar *)&local_28,0x10);
      fclose(__s);
      return 0;
    }
    if (err == (char **)0x0) goto LAB_001434c8;
    pcVar4 = "Flag write failed.";
  }
  else {
    if (err == (char **)0x0) goto LAB_001434c8;
    pcVar4 = "Header write failed.";
  }
  *err = pcVar4;
LAB_001434c8:
  fclose(__s);
  return -3;
}

Assistant:

int SaveDeepEXR(const DeepImage *deepImage, const char *filename,
                const char **err) {
  if (deepImage == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot write file.";
    }
    return -1;
  }

  // Write header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    size_t n = fwrite(header, 1, 4, fp);
    if (n != 4) {
      if (err) {
        (*err) = "Header write failed.";
      }
      fclose(fp);
      return -3;
    }
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    const char data[] = {2, 8, 0, 0};
    size_t n = fwrite(data, 1, 4, fp);
    if (n != 4) {
      if (err) {
        (*err) = "Flag write failed.";
      }
      fclose(fp);
      return -3;
    }
  }

  // Write attributes.
  {
    int data = 2; // ZIPS
    WriteAttribute(fp, "compression", "compression",
                   reinterpret_cast<const unsigned char *>(&data), sizeof(int));
  }

  {
    int data[4] = {0, 0, deepImage->width - 1, deepImage->height - 1};
    WriteAttribute(fp, "dataWindow", "box2i",
                   reinterpret_cast<const unsigned char *>(data),
                   sizeof(int) * 4);
    WriteAttribute(fp, "displayWindow", "box2i",
                   reinterpret_cast<const unsigned char *>(data),
                   sizeof(int) * 4);
  }

  int numScanlineBlocks = 1;
  // Write offset tables.
  int numBlocks = deepImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < deepImage->height) {
    numBlocks++;
  }

#if 0 // @todo
  std::vector<long long> offsets(numBlocks);

  //std::vector<int> pixelOffsetTable(dataWidth);

  // compress pixel offset table.
  {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      Compresses(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      //      int ret =
      //          miniz::mz_uncompress(reinterpret_cast<unsigned char
      //          *>(&pixelOffsetTable.at(0)), &dstLen, dataPtr + 28,
      //          packedOffsetTableSize);
      //      printf("ret = %d, dstLen = %d\n", ret, (int)dstLen);
      //
      for (int i = 0; i < dataWidth; i++) {
        // printf("offt[%d] = %d\n", i, pixelOffsetTable[i]);
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }


  for (int y = 0; y < numBlocks; y++) {
    //long long offset = *(reinterpret_cast<const long long *>(marker));
    // printf("offset[%d] = %lld\n", y, offset);
    //marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  // Write offset table.
  fwrite(&offsets.at(0), sizeof(long long), numBlocks, fp);

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo = *reinterpret_cast<const int *>(dataPtr);
    long long packedOffsetTableSize =
        *reinterpret_cast<const long long *>(dataPtr + 4);
    long long packedSampleDataSize =
        *reinterpret_cast<const long long *>(dataPtr + 12);
    long long unpackedSampleDataSize =
        *reinterpret_cast<const long long *>(dataPtr + 20);
    // printf("line: %d, %lld/%lld/%lld\n", lineNo, packedOffsetTableSize,
    // packedSampleDataSize, unpackedSampleDataSize);

    int endLineNo = (std::min)(lineNo + numScanlineBlocks, dataHeight);

    int numLines = endLineNo - lineNo;
    // printf("numLines: %d\n", numLines);

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      //      int ret =
      //          miniz::mz_uncompress(reinterpret_cast<unsigned char
      //          *>(&pixelOffsetTable.at(0)), &dstLen, dataPtr + 28,
      //          packedOffsetTableSize);
      //      printf("ret = %d, dstLen = %d\n", ret, (int)dstLen);
      //
      for (int i = 0; i < dataWidth; i++) {
        // printf("offt[%d] = %d\n", i, pixelOffsetTable[i]);
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      // printf("dstLen = %d\n", dstLen);
      // printf("srcLen = %d\n", packedSampleDataSize);
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        // printf("offt[%d] = %d\n", i, channelOffset);
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == 0) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == 1) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == 2) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert(pixelOffsetTable[dataWidth - 1] * sampleSize == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        // unsigned int channelOffset = channelOffsetList[c];
        // unsigned int i = channelOffset;
        // printf("channel = %d. name = %s. ty = %d\n", c,
        // channels[c].name.c_str(), channels[c].pixelType);

        // printf("dataOffset = %d\n", (int)dataOffset);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
            // printf("c[%d]  f(half) = %f (0x%08x)\n", c, f32.f, f16.u);
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            // printf("  f = %f(0x%08x)\n", f, *((unsigned int *)&f));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
      // printf("total: %d\n", dataOffset);
    }

  } // y
#endif
  fclose(fp);

  return 0; // OK
}